

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
iqxmlrpc::(anonymous_namespace)::authenticate_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,Packet *pkt,Auth_Plugin_base *ap)

{
  bool bVar1;
  Header *pHVar2;
  Request_header *this_00;
  Unauthorized *pUVar3;
  undefined1 local_78 [8];
  string password;
  string username;
  Request_header *hdr;
  Auth_Plugin_base *ap_local;
  Packet *pkt_local;
  
  if (pkt == (Packet *)0x0) {
    boost::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional(__return_storage_ptr__);
  }
  else {
    pHVar2 = http::Packet::header((Packet *)this);
    this_00 = (Request_header *)
              __dynamic_cast(pHVar2,&http::Header::typeinfo,&http::Request_header::typeinfo,0);
    if (this_00 == (Request_header *)0x0) {
      __cxa_bad_cast();
    }
    bVar1 = http::Request_header::has_authinfo(this_00);
    if (bVar1) {
      std::__cxx11::string::string((string *)(password.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_78);
      http::Request_header::get_authinfo
                (this_00,(string *)(password.field_2._M_local_buf + 8),(string *)local_78);
      bVar1 = Auth_Plugin_base::authenticate
                        ((Auth_Plugin_base *)pkt,(string *)((long)&password.field_2 + 8),
                         (string *)local_78);
      if (!bVar1) {
        pUVar3 = (Unauthorized *)__cxa_allocate_exception(0x50);
        http::Unauthorized::Unauthorized(pUVar3);
        __cxa_throw(pUVar3,&http::Unauthorized::typeinfo,http::Unauthorized::~Unauthorized);
      }
      boost::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional(__return_storage_ptr__,(rval_reference_type)((long)&password.field_2 + 8));
      std::__cxx11::string::~string((string *)local_78);
      std::__cxx11::string::~string((string *)(password.field_2._M_local_buf + 8));
    }
    else {
      bVar1 = Auth_Plugin_base::authenticate_anonymous((Auth_Plugin_base *)pkt);
      if (!bVar1) {
        pUVar3 = (Unauthorized *)__cxa_allocate_exception(0x50);
        http::Unauthorized::Unauthorized(pUVar3);
        __cxa_throw(pUVar3,&http::Unauthorized::typeinfo,http::Unauthorized::~Unauthorized);
      }
      boost::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

boost::optional<std::string>
authenticate(const http::Packet& pkt, const Auth_Plugin_base* ap)
{
  using namespace http;

  if (!ap)
    return boost::optional<std::string>();

  const Request_header& hdr =
    dynamic_cast<const Request_header&>(*pkt.header());

  if (!hdr.has_authinfo())
  {
    if (!ap->authenticate_anonymous())
      throw Unauthorized();

    return boost::optional<std::string>();
  }

  std::string username, password;
  hdr.get_authinfo(username, password);

  if (!ap->authenticate(username, password))
    throw Unauthorized();

  return username;
}